

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

void R_CalcTiltedLighting(double lval,double lend,int width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  BYTE *pBVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  BYTE *in_RDX;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  BYTE **ppBVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  
  pBVar3 = basecolormap->Maps;
  if ((width == 0) || (lval == lend)) {
    if (24.0 <= lval) {
      lval = 24.0;
    }
    iVar6 = planeshade - SUB84(lval + 103079215104.0,0) >> 0x10;
    iVar4 = 0x1f;
    if (iVar6 < 0x1f) {
      iVar4 = iVar6;
    }
    uVar9 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    pBVar3 = pBVar3 + (uint)(iVar4 << 8);
  }
  else {
    dVar13 = (lend - lval) / (double)width;
    if (24.0 <= lval) {
      dVar14 = 24.0;
      if (lval <= 24.0) {
        dVar14 = lval;
      }
      iVar6 = planeshade - SUB84(dVar14 + 103079215104.0,0) >> 0x10;
      iVar4 = 0x1f;
      if (iVar6 < 0x1f) {
        iVar4 = iVar6;
      }
      uVar9 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      in_RDX = pBVar3 + (uint)(iVar4 << 8);
      if (-1 < width) {
        ppBVar11 = tiltlighting;
        uVar5 = 0;
        do {
          *ppBVar11 = in_RDX;
          lval = lval + dVar13;
          uVar9 = uVar5 + 1;
          if ((uint)width <= uVar5) break;
          ppBVar11 = ppBVar11 + 1;
          uVar5 = uVar9;
        } while (24.0 <= lval);
      }
    }
    else {
      uVar9 = 0;
    }
    uVar7 = (uint)uVar9;
    if (24.0 <= lend) {
      dVar14 = 24.0;
      if (lend <= 24.0) {
        dVar14 = lend;
      }
      iVar6 = planeshade - SUB84(dVar14 + 103079215104.0,0) >> 0x10;
      iVar4 = 0x1f;
      if (iVar6 < 0x1f) {
        iVar4 = iVar6;
      }
      iVar6 = 0;
      if (0 < iVar4) {
        iVar6 = iVar4;
      }
      in_RDX = pBVar3 + (uint)(iVar6 << 8);
      if ((int)uVar7 < width) {
        lVar8 = (long)width;
        ppBVar11 = tiltlighting + lVar8;
        do {
          lVar8 = lVar8 + -1;
          *ppBVar11 = in_RDX;
          lend = lend - dVar13;
          width = width - 1;
          if (lVar8 <= (int)uVar7) break;
          ppBVar11 = ppBVar11 + -1;
        } while (24.0 <= lend);
      }
    }
    if (width < 1) goto LAB_00308073;
    dVar14 = (double)planeshade * 1.52587890625e-05 - lval;
    dVar13 = (lval - lend) / (double)width;
    if (0.0 <= dVar13) {
      if (dVar14 < 31.0) {
        if ((int)uVar7 <= width && dVar14 < 0.0) {
          ppBVar11 = tiltlighting + (uVar9 & 0xffffffff);
          do {
            *ppBVar11 = pBVar3;
            dVar14 = dVar14 + dVar13;
            iVar4 = (int)uVar9;
            uVar7 = iVar4 + 1;
            if (0.0 <= dVar14) break;
            ppBVar11 = ppBVar11 + 1;
            uVar9 = (ulong)uVar7;
          } while (iVar4 < width);
        }
        if (width < (int)uVar7) {
          return;
        }
        if (dVar14 < 31.0) {
          ppBVar11 = tiltlighting + uVar7;
          uVar10 = uVar7;
          do {
            *ppBVar11 = pBVar3 + (SUB84(dVar14 + 6755399441055744.0,0) << 8);
            uVar7 = uVar10 + 1;
            if (width <= (int)uVar10) break;
            dVar14 = dVar14 + dVar13;
            ppBVar11 = ppBVar11 + 1;
            uVar10 = uVar7;
          } while (dVar14 < 31.0);
        }
        in_RDX = pBVar3 + 0x1f00;
        goto LAB_00308073;
      }
      pBVar3 = pBVar3 + 0x1f00;
    }
    else if (1.0 <= dVar14) {
      if (32.0 <= dVar14) {
        if (width < (int)uVar7) {
          uVar9 = uVar9 & 0xffffffff;
        }
        else {
          ppBVar11 = tiltlighting + (uVar9 & 0xffffffff);
          do {
            *ppBVar11 = pBVar3 + 0x1f00;
            dVar14 = dVar14 + dVar13;
            iVar4 = (int)uVar9;
            uVar9 = (ulong)(iVar4 + 1);
            if (dVar14 < 32.0) break;
            ppBVar11 = ppBVar11 + 1;
          } while (iVar4 < width);
        }
        if (width < (int)uVar9) {
          return;
        }
      }
      iVar4 = (int)uVar9;
      if ((iVar4 <= width) && (0.0 <= dVar14)) {
        ppBVar11 = tiltlighting + iVar4;
        uVar5 = (long)iVar4;
        do {
          uVar9 = uVar5 + 1;
          *ppBVar11 = pBVar3 + (SUB84(dVar14 + 6755399441055744.0,0) << 8);
          if ((long)(ulong)(uint)width <= (long)uVar5) break;
          dVar14 = dVar14 + dVar13;
          ppBVar11 = ppBVar11 + 1;
          uVar5 = uVar9;
        } while (0.0 <= dVar14);
      }
    }
  }
  uVar7 = (uint)uVar9;
  in_RDX = pBVar3;
LAB_00308073:
  auVar2 = _DAT_0073b300;
  auVar1 = _DAT_0073b2f0;
  uVar10 = width - uVar7;
  if ((int)uVar7 <= width) {
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar10;
    auVar12._8_4_ = uVar10;
    auVar12._12_4_ = 0;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_0073b300;
    do {
      auVar15._8_4_ = (int)uVar9;
      auVar15._0_8_ = uVar9;
      auVar15._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar15 | auVar1) ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        tiltlighting[(long)(int)uVar7 + uVar9] = in_RDX;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        *(BYTE **)((long)(int)uVar7 * 8 + 0x8f32e8 + uVar9 * 8) = in_RDX;
      }
      uVar9 = uVar9 + 2;
    } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar9);
  }
  return;
}

Assistant:

void R_CalcTiltedLighting (double lval, double lend, int width)
{
	double lstep;
	BYTE *lightfiller;
	BYTE *basecolormapdata = basecolormap->Maps;
	int i = 0;

	if (width == 0 || lval == lend)
	{ // Constant lighting
		lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
	}
	else
	{
		lstep = (lend - lval) / width;
		if (lval >= MAXLIGHTVIS)
		{ // lval starts "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
			for (; i <= width && lval >= MAXLIGHTVIS; ++i)
			{
				tiltlighting[i] = lightfiller;
				lval += lstep;
			}
		}
		if (lend >= MAXLIGHTVIS)
		{ // lend ends "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
			for (; width > i && lend >= MAXLIGHTVIS; --width)
			{
				tiltlighting[width] = lightfiller;
				lend -= lstep;
			}
		}
		if (width > 0)
		{
			lval = FIXED2DBL(planeshade) - lval;
			lend = FIXED2DBL(planeshade) - lend;
			lstep = (lend - lval) / width;
			if (lstep < 0)
			{ // Going from dark to light
				if (lval < 1.)
				{ // All bright
					lightfiller = basecolormapdata;
				}
				else
				{
					if (lval >= NUMCOLORMAPS)
					{ // Starts beyond the dark end
						BYTE *clight = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
						while (lval >= NUMCOLORMAPS && i <= width)
						{
							tiltlighting[i++] = clight;
							lval += lstep;
						}
						if (i > width)
							return;
					}
					while (i <= width && lval >= 0)
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata;
				}
			}
			else
			{ // Going from light to dark
				if (lval >= (NUMCOLORMAPS-1))
				{ // All dark
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
				else
				{
					while (lval < 0 && i <= width)
					{
						tiltlighting[i++] = basecolormapdata;
						lval += lstep;
					}
					if (i > width)
						return;
					while (i <= width && lval < (NUMCOLORMAPS-1))
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
			}
		}
	}
	for (; i <= width; i++)
	{
		tiltlighting[i] = lightfiller;
	}
}